

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

db_bit * __thiscall lan::db::get_array_data(db *this,string *content)

{
  int iVar1;
  db_bit *pdVar2;
  db_bit *pdVar3;
  long lVar4;
  string buffer;
  string local_38;
  
  pop_next(&local_38,(db *)content,content);
  iVar1 = tolower((int)*local_38._M_dataplus._M_p);
  lVar4 = 0;
  do {
    if ((char)iVar1 == (&db_bit_table)[lVar4]) goto LAB_00105409;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb);
  lVar4 = 8;
LAB_00105409:
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 == 0) {
LAB_00105446:
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 != 0) goto LAB_00105459;
LAB_00105465:
    pdVar2 = read_container_bit(this,content,true);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 == 0) goto LAB_00105446;
    std::__cxx11::string::replace((ulong)content,0,(char *)0x0,(ulong)local_38._M_dataplus._M_p);
LAB_00105459:
    if ((int)lVar4 == 8) {
      pdVar2 = (db_bit *)0x0;
      goto LAB_0010549e;
    }
    if ((int)lVar4 == 10) goto LAB_00105465;
    pdVar2 = read_value_bit(this,content,true);
  }
  pdVar3 = get_array_data(this,content);
  pdVar2->nex = pdVar3;
LAB_0010549e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pdVar2;
}

Assistant:

lan::db_bit * db::get_array_data(std::string & content){
            db_bit_type type = Unsafe;
            std::string buffer = pop_next(content);
            db_bit * bit = nullptr;
            type = convert_to_bit_type(buffer[0]);
            if(buffer != "]" and buffer != "(")
                content.insert(0, buffer);
            else if(buffer == "(")
                type = Container;
            if(type != Unsafe){
                switch(type){
                    case Container: bit = read_container_bit(content, true); break;
                    default: bit = read_value_bit(content, true); break;
                } bit->nex = (bit) ? get_array_data(content) : nullptr;
            } return bit;
        }